

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int http_send_error(http_s *r,size_t error)

{
  long lVar1;
  FIOBJ name;
  int iVar2;
  size_t sVar3;
  FIOBJ value;
  size_t sVar4;
  char *data;
  ulong uVar5;
  char buffer [16];
  char local_28;
  char local_27 [4];
  undefined2 auStack_23 [5];
  
  iVar2 = -1;
  if (r != (http_s *)0x0) {
    if ((r->private_data).out_headers != 0) {
      sVar4 = 500;
      if (0xfffffffffffffc7b < error - 1000) {
        sVar4 = error;
      }
      r->status = sVar4;
      local_28 = '/';
      sVar3 = fio_ltoa(local_27,sVar4,'\n');
      builtin_strncpy(local_27 + sVar3,".htm",4);
      *(undefined2 *)((long)auStack_23 + sVar3) = 0x6c;
      lVar1 = *(long *)((r->private_data).flag + 0x38);
      iVar2 = http_sendfile2(r,*(char **)(lVar1 + 0x28),*(size_t *)(lVar1 + 0x30),&local_28,
                             sVar3 + 6);
      name = HTTP_HEADER_CONTENT_TYPE;
      if (iVar2 != 0) {
        value = http_mimetype_find("txt",3);
        http_set_header(r,name,value);
        uVar5 = sVar4 - 100;
        if ((uVar5 < 0x19c) && (data = http_status2str::status2str[uVar5].data, data != (char *)0x0)
           ) {
          sVar4 = http_status2str::status2str[uVar5].len;
        }
        else {
          sVar4 = 0x15;
          data = "Internal Server Error";
        }
        http_send_body(r,data,sVar4);
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int http_send_error(http_s *r, size_t error) {
  if (!r || !r->private_data.out_headers) {
    return -1;
  }
  if (error < 100 || error >= 1000)
    error = 500;
  r->status = error;
  char buffer[16];
  buffer[0] = '/';
  size_t pos = 1 + fio_ltoa(buffer + 1, error, 10);
  buffer[pos++] = '.';
  buffer[pos++] = 'h';
  buffer[pos++] = 't';
  buffer[pos++] = 'm';
  buffer[pos++] = 'l';
  buffer[pos] = 0;
  if (http_sendfile2(r, http2protocol(r)->settings->public_folder,
                     http2protocol(r)->settings->public_folder_length, buffer,
                     pos)) {
    http_set_header(r, HTTP_HEADER_CONTENT_TYPE,
                    http_mimetype_find((char *)"txt", 3));
    fio_str_info_s t = http_status2str(error);
    http_send_body(r, t.data, t.len);
  }
  return 0;
}